

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileOptions::SharedCtor(FileOptions *this,Arena *arena)

{
  Arena *arena_local;
  FileOptions *this_local;
  
  protobuf::MessageLite::internal_visibility();
  Impl_::Impl_((Impl_ *)&this->field_0);
  memset((void *)((long)&this->field_0 + 0x88),0,0xf);
  return;
}

Assistant:

inline void FileOptions::SharedCtor(::_pb::Arena* PROTOBUF_NULLABLE arena) {
  new (&_impl_) Impl_(internal_visibility(), arena);
  ::memset(reinterpret_cast<char *>(&_impl_) +
               offsetof(Impl_, features_),
           0,
           offsetof(Impl_, java_string_check_utf8_) -
               offsetof(Impl_, features_) +
               sizeof(Impl_::java_string_check_utf8_));
}